

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::decompress(PixelBufferAccess *dst,CompressedTexFormat fmt,deUint8 *src,
                    TexDecompressionParams *params)

{
  tcu *this;
  int *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  deInt32 x_;
  deInt32 y_;
  deInt32 z_;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TextureFormat *this_01;
  reference data;
  PixelBufferAccess local_148;
  PixelBufferAccess local_120;
  undefined1 local_f4 [8];
  IVec3 dstPixelPos;
  IVec3 copySize;
  deUint8 *blockPtr;
  IVec3 blockPos;
  int blockX;
  int blockY;
  int blockZ;
  undefined1 local_a8 [8];
  PixelBufferAccess blockAccess;
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBlock;
  IVec3 blockPitches;
  IVec3 blockCount;
  IVec3 blockPixelSize;
  int blockSize;
  TexDecompressionParams *params_local;
  deUint8 *src_local;
  CompressedTexFormat fmt_local;
  PixelBufferAccess *dst_local;
  
  iVar1 = getBlockSize(fmt);
  this = (tcu *)(blockCount.m_data + 1);
  getBlockPixelSize(this,fmt);
  iVar2 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  iVar3 = Vector<int,_3>::x((Vector<int,_3> *)this);
  x_ = deDivRoundUp32(iVar2,iVar3);
  iVar2 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  iVar3 = Vector<int,_3>::y((Vector<int,_3> *)this);
  y_ = deDivRoundUp32(iVar2,iVar3);
  iVar2 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
  iVar3 = Vector<int,_3>::z((Vector<int,_3> *)this);
  z_ = deDivRoundUp32(iVar2,iVar3);
  this_00 = blockPitches.m_data + 1;
  Vector<int,_3>::Vector((Vector<int,_3> *)this_00,x_,y_,z_);
  iVar2 = Vector<int,_3>::x((Vector<int,_3> *)this_00);
  iVar3 = Vector<int,_3>::x((Vector<int,_3> *)this_00);
  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)this_00);
  Vector<int,_3>::Vector
            ((Vector<int,_3> *)
             &uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar1,iVar1 * iVar2,
             iVar1 * iVar3 * iVar4);
  this_01 = ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  iVar1 = TextureFormat::getPixelSize(this_01);
  iVar2 = Vector<int,_3>::x((Vector<int,_3> *)this);
  iVar3 = Vector<int,_3>::y((Vector<int,_3> *)this);
  iVar4 = Vector<int,_3>::z((Vector<int,_3> *)this);
  std::allocator<unsigned_char>::allocator(&local_69);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
             (long)(iVar1 * iVar2 * iVar3 * iVar4),&local_69);
  std::allocator<unsigned_char>::~allocator(&local_69);
  _blockY = getUncompressedFormat(fmt);
  iVar1 = Vector<int,_3>::x((Vector<int,_3> *)(blockCount.m_data + 1));
  iVar2 = Vector<int,_3>::y((Vector<int,_3> *)(blockCount.m_data + 1));
  iVar3 = Vector<int,_3>::z((Vector<int,_3> *)(blockCount.m_data + 1));
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_a8,(TextureFormat *)&blockY,iVar1,iVar2,iVar3,data);
  blockX = 0;
  while( true ) {
    iVar1 = Vector<int,_3>::z((Vector<int,_3> *)(blockPitches.m_data + 1));
    if (iVar1 <= blockX) break;
    blockPos.m_data[2] = 0;
    while( true ) {
      iVar1 = blockPos.m_data[2];
      iVar2 = Vector<int,_3>::y((Vector<int,_3> *)(blockPitches.m_data + 1));
      if (iVar2 <= iVar1) break;
      blockPos.m_data[1] = 0;
      while( true ) {
        iVar1 = blockPos.m_data[1];
        iVar2 = Vector<int,_3>::x((Vector<int,_3> *)(blockPitches.m_data + 1));
        if (iVar2 <= iVar1) break;
        Vector<int,_3>::Vector
                  ((Vector<int,_3> *)&blockPtr,blockPos.m_data[1],blockPos.m_data[2],blockX);
        operator*((tcu *)(copySize.m_data + 1),(Vector<int,_3> *)&blockPtr,
                  (Vector<int,_3> *)
                  &uncompressedBlock.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        iVar1 = anon_unknown_0::componentSum((IVec3 *)(copySize.m_data + 1));
        iVar2 = Vector<int,_3>::x((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar3 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
        iVar4 = Vector<int,_3>::x((Vector<int,_3> *)&blockPtr);
        iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar2 = de::min<int>(iVar2,iVar3 - iVar4 * iVar5);
        iVar3 = Vector<int,_3>::y((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar4 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)&blockPtr);
        iVar6 = Vector<int,_3>::y((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar3 = de::min<int>(iVar3,iVar4 - iVar5 * iVar6);
        iVar4 = Vector<int,_3>::z((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar5 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
        iVar6 = Vector<int,_3>::z((Vector<int,_3> *)&blockPtr);
        iVar7 = Vector<int,_3>::z((Vector<int,_3> *)(blockCount.m_data + 1));
        iVar4 = de::min<int>(iVar4,iVar5 - iVar6 * iVar7);
        Vector<int,_3>::Vector((Vector<int,_3> *)(dstPixelPos.m_data + 1),iVar2,iVar3,iVar4);
        operator*((tcu *)local_f4,(Vector<int,_3> *)&blockPtr,
                  (Vector<int,_3> *)(blockCount.m_data + 1));
        anon_unknown_0::decompressBlock(fmt,(PixelBufferAccess *)local_a8,src + iVar1,params);
        iVar1 = Vector<int,_3>::x((Vector<int,_3> *)local_f4);
        iVar2 = Vector<int,_3>::y((Vector<int,_3> *)local_f4);
        iVar3 = Vector<int,_3>::z((Vector<int,_3> *)local_f4);
        iVar4 = Vector<int,_3>::x((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        iVar6 = Vector<int,_3>::z((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        getSubregion(&local_120,dst,iVar1,iVar2,iVar3,iVar4,iVar5,iVar6);
        iVar1 = Vector<int,_3>::x((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        iVar2 = Vector<int,_3>::y((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        iVar3 = Vector<int,_3>::z((Vector<int,_3> *)(dstPixelPos.m_data + 1));
        getSubregion(&local_148,(PixelBufferAccess *)local_a8,0,0,0,iVar1,iVar2,iVar3);
        copy((EVP_PKEY_CTX *)&local_120,(EVP_PKEY_CTX *)&local_148);
        blockPos.m_data[1] = blockPos.m_data[1] + 1;
      }
      blockPos.m_data[2] = blockPos.m_data[2] + 1;
    }
    blockX = blockX + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, CompressedTexFormat fmt, const deUint8* src, const TexDecompressionParams& params)
{
	const int				blockSize			= getBlockSize(fmt);
	const IVec3				blockPixelSize		(getBlockPixelSize(fmt));
	const IVec3				blockCount			(deDivRoundUp32(dst.getWidth(),		blockPixelSize.x()),
												 deDivRoundUp32(dst.getHeight(),	blockPixelSize.y()),
												 deDivRoundUp32(dst.getDepth(),		blockPixelSize.z()));
	const IVec3				blockPitches		(blockSize, blockSize * blockCount.x(), blockSize * blockCount.x() * blockCount.y());

	std::vector<deUint8>	uncompressedBlock	(dst.getFormat().getPixelSize() * blockPixelSize.x() * blockPixelSize.y() * blockPixelSize.z());
	const PixelBufferAccess	blockAccess			(getUncompressedFormat(fmt), blockPixelSize.x(), blockPixelSize.y(), blockPixelSize.z(), &uncompressedBlock[0]);

	DE_ASSERT(dst.getFormat() == getUncompressedFormat(fmt));

	for (int blockZ = 0; blockZ < blockCount.z(); blockZ++)
	for (int blockY = 0; blockY < blockCount.y(); blockY++)
	for (int blockX = 0; blockX < blockCount.x(); blockX++)
	{
		const IVec3				blockPos	(blockX, blockY, blockZ);
		const deUint8* const	blockPtr	= src + componentSum(blockPos * blockPitches);
		const IVec3				copySize	(de::min(blockPixelSize.x(), dst.getWidth()		- blockPos.x() * blockPixelSize.x()),
											 de::min(blockPixelSize.y(), dst.getHeight()	- blockPos.y() * blockPixelSize.y()),
											 de::min(blockPixelSize.z(), dst.getDepth()		- blockPos.z() * blockPixelSize.z()));
		const IVec3				dstPixelPos	= blockPos * blockPixelSize;

		decompressBlock(fmt, blockAccess, blockPtr, params);

		copy(getSubregion(dst, dstPixelPos.x(), dstPixelPos.y(), dstPixelPos.z(), copySize.x(), copySize.y(), copySize.z()), getSubregion(blockAccess, 0, 0, 0, copySize.x(), copySize.y(), copySize.z()));
	}
}